

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_fence(void)

{
  long lVar1;
  
  if (GA_fence_set < 1) {
    pnga_error("ga_fence: fence not initialized",0);
  }
  GA_fence_set = GA_fence_set + -1;
  if (0 < GAnproc) {
    lVar1 = 0;
    do {
      if (fence_array[lVar1] != '\0') {
        ARMCI_Fence((int)lVar1);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < GAnproc);
  }
  memset(fence_array,0,(long)(int)GAnproc);
  return;
}

Assistant:

void pnga_fence()
{
    int proc;
    if(GA_fence_set<1)pnga_error("ga_fence: fence not initialized",0);
    GA_fence_set--;
    for(proc=0;proc<GAnproc;proc++)if(fence_array[proc])ARMCI_Fence(proc);
    bzero(fence_array,(int)GAnproc);
}